

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TransitionOrVerifyBLASState
          (DeviceContextVkImpl *this,BottomLevelASVkImpl *BLAS,
          RESOURCE_STATE_TRANSITION_MODE TransitionMode,RESOURCE_STATE RequiredState,
          char *OperationName)

{
  bool bVar1;
  RenderPassVkImpl *pRVar2;
  Char *Message;
  undefined1 local_48 [8];
  string msg;
  char *OperationName_local;
  RESOURCE_STATE RequiredState_local;
  RESOURCE_STATE_TRANSITION_MODE TransitionMode_local;
  BottomLevelASVkImpl *BLAS_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = OperationName;
  if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) {
    pRVar2 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                       ((RefCntAutoPtr *)
                        &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
    if (pRVar2 != (RenderPassVkImpl *)0x0) {
      FormatString<char[55]>
                ((string *)local_48,
                 (char (*) [55])"State transitions are not allowed inside a render pass");
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"TransitionOrVerifyBLASState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xcec);
      std::__cxx11::string::~string((string *)local_48);
    }
    bVar1 = BottomLevelASBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&BLAS->super_BottomLevelASBase<Diligent::EngineVkImplTraits>);
    if (bVar1) {
      TransitionBLASState(this,BLAS,RESOURCE_STATE_UNKNOWN,RequiredState,true);
    }
  }
  else if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY) {
    DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyBLASState
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,BLAS,RequiredState,
               OperationName);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionOrVerifyBLASState(BottomLevelASVkImpl&           BLAS,
                                                      RESOURCE_STATE_TRANSITION_MODE TransitionMode,
                                                      RESOURCE_STATE                 RequiredState,
                                                      const char*                    OperationName)
{
    if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
    {
        VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
        if (BLAS.IsInKnownState())
        {
            TransitionBLASState(BLAS, RESOURCE_STATE_UNKNOWN, RequiredState, true);
        }
    }
#ifdef DILIGENT_DEVELOPMENT
    else if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
    {
        DvpVerifyBLASState(BLAS, RequiredState, OperationName);
    }
#endif
}